

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

Am_Wrapper * __thiscall Am_Connection_Data::Make_Unique(Am_Connection_Data *this)

{
  bool bVar1;
  Am_Connection_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Am_Connection_Data *)operator_new(0x48);
    Am_Connection_Data(this_local,this);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

Am_Connection_Data::Am_Connection_Data(void)
{
  m_socket = 1;             // Stdout on unix, shouldn't be used anyway
  connected = false;        // Connection flag: Am I Connected?
  waiting = false;          // Am I waiting to accept an incoming conn?
  Value_Queue.Make_Empty(); // Processed incoming data (None yet)
  List_Queue = nullptr;        // Lists being read in
  Object_Queue = nullptr;      // Objects being read in
}